

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

void Gia_ManOrigIdsRemap(Gia_Man_t *p,Gia_Man_t *pNew)

{
  Vec_Int_t *pVVar1;
  int Entry;
  int iVar2;
  Gia_Obj_t *pGVar3;
  bool bVar4;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew_local;
  Gia_Man_t *p_local;
  
  if (p->vIdsOrig != (Vec_Int_t *)0x0) {
    Gia_ManOrigIdsStart(pNew);
    Vec_IntWriteEntry(pNew->vIdsOrig,0,0);
    local_24 = 1;
    while( true ) {
      bVar4 = false;
      if (local_24 < p->nObjs) {
        pGStack_20 = Gia_ManObj(p,local_24);
        bVar4 = pGStack_20 != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      if (((pGStack_20->Value != 0xffffffff) && (iVar2 = Abc_Lit2Var(pGStack_20->Value), iVar2 != 0)
          ) && (iVar2 = Vec_IntEntry(p->vIdsOrig,local_24), iVar2 != -1)) {
        pVVar1 = pNew->vIdsOrig;
        iVar2 = Abc_Lit2Var(pGStack_20->Value);
        iVar2 = Vec_IntEntry(pVVar1,iVar2);
        if (iVar2 == -1) {
          pVVar1 = pNew->vIdsOrig;
          iVar2 = Abc_Lit2Var(pGStack_20->Value);
          Entry = Vec_IntEntry(p->vIdsOrig,local_24);
          Vec_IntWriteEntry(pVVar1,iVar2,Entry);
        }
      }
      local_24 = local_24 + 1;
    }
    local_24 = 0;
    while( true ) {
      bVar4 = false;
      if (local_24 < pNew->nObjs) {
        pGVar3 = Gia_ManObj(pNew,local_24);
        bVar4 = pGVar3 != (Gia_Obj_t *)0x0;
      }
      if (!bVar4) break;
      iVar2 = Vec_IntEntry(pNew->vIdsOrig,local_24);
      if (iVar2 < 0) {
        __assert_fail("Vec_IntEntry(pNew->vIdsOrig, i) >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                      ,0x43,"void Gia_ManOrigIdsRemap(Gia_Man_t *, Gia_Man_t *)");
      }
      local_24 = local_24 + 1;
    }
  }
  return;
}

Assistant:

void Gia_ManOrigIdsRemap( Gia_Man_t * p, Gia_Man_t * pNew )
{
    Gia_Obj_t * pObj; int i;
    if ( p->vIdsOrig == NULL )
        return;
    Gia_ManOrigIdsStart( pNew );
    Vec_IntWriteEntry( pNew->vIdsOrig, 0, 0 );
    Gia_ManForEachObj1( p, pObj, i )
        if ( ~pObj->Value && Abc_Lit2Var(pObj->Value) && Vec_IntEntry(p->vIdsOrig, i) != -1 && Vec_IntEntry(pNew->vIdsOrig, Abc_Lit2Var(pObj->Value)) == -1 )
            Vec_IntWriteEntry( pNew->vIdsOrig, Abc_Lit2Var(pObj->Value), Vec_IntEntry(p->vIdsOrig, i) );
    Gia_ManForEachObj( pNew, pObj, i )
        assert( Vec_IntEntry(pNew->vIdsOrig, i) >= 0 );
}